

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

sequence_gap_structure *
describe_sequence(sequence_gap_structure *__return_storage_ptr__,char *source,
                 unsigned_long sequence_length,unsigned_long char_count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long char_idx;
  ulong uVar10;
  
  uVar1 = sequence_length + 1;
  uVar5 = 0x7fffffffffffffff;
  uVar3 = 0;
  uVar6 = 0;
  uVar2 = 0;
  uVar4 = uVar1;
  uVar9 = uVar1;
  for (uVar10 = 0; sequence_length != uVar10; uVar10 = uVar10 + 1) {
    uVar7 = uVar5;
    if (uVar10 < uVar5) {
      uVar7 = uVar10;
    }
    uVar8 = uVar6;
    if (uVar6 < uVar10) {
      uVar8 = uVar10;
    }
    if ((long)source[uVar10] != 0x11) {
      uVar5 = uVar7;
      uVar6 = uVar8;
    }
    if ((ulong)(long)source[uVar10] < char_count) {
      uVar2 = uVar10;
      if (uVar10 < uVar9) {
        uVar9 = uVar10;
      }
    }
    else {
      if (((long)uVar9 <= (long)uVar2) && ((long)(uVar3 - uVar4) < (long)(uVar2 - uVar9))) {
        uVar3 = uVar2;
        uVar4 = uVar9;
      }
      uVar2 = 0;
      uVar9 = uVar1;
    }
  }
  __return_storage_ptr__->first_nongap = uVar5;
  __return_storage_ptr__->last_nongap = uVar6;
  __return_storage_ptr__->resolved_end = uVar3;
  __return_storage_ptr__->resolved_start = uVar4;
  if (((long)uVar9 <= (long)uVar2) && ((long)(uVar3 - uVar4) < (long)(uVar2 - uVar9))) {
    __return_storage_ptr__->resolved_start = uVar9;
    __return_storage_ptr__->resolved_end = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

struct sequence_gap_structure describe_sequence (const char* source, const unsigned long sequence_length, const unsigned long char_count) {
  sequence_gap_structure result;
  
  long start_run = sequence_length + 1UL,
       end_run = 0L;
  
  result.resolved_end = end_run;
  result.resolved_start = start_run;
  
  for (unsigned long char_idx = 0UL; char_idx < sequence_length; char_idx++) {
    unsigned long this_char = source[char_idx];
    if (this_char != GAP) {
      if (char_idx < result.first_nongap) {
        result.first_nongap = char_idx;
      }
      if (char_idx > result.last_nongap) {
        result.last_nongap = char_idx;
      }
      
    }
    if (this_char < char_count) { // not an ambig
      if (char_idx < start_run) {
        end_run = start_run = char_idx;
      } else {
        end_run = char_idx;
      }
    } else { // an ambig
      if (end_run >= start_run) {
        if (end_run - start_run > result.resolved_end - result.resolved_start) {
          result.resolved_start = start_run;
          result.resolved_end = end_run;
        }
      }
      start_run = sequence_length + 1UL;
      end_run = 0L;
    }
  }
  if (end_run >= start_run) {
    if (end_run - start_run > result.resolved_end - result.resolved_start) {
      result.resolved_start = start_run;
      result.resolved_end = end_run;
    }
  }
  
  //cout << sequence_length << "/" << char_count << endl << result.first_nongap << "," 
  //     << result.last_nongap << " : " << result.resolved_start << "," << result.resolved_end << endl;
  
  return result;
}